

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorter.h
# Opt level: O1

void soplex::
     SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxElement,soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>::IdxCompare>
               (IdxElement *keys,int end,IdxCompare *compare,int start)

{
  IdxElement *pIVar1;
  uint *puVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  fpclass_type fVar6;
  int32_t iVar7;
  bool bVar8;
  int iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  undefined8 uVar23;
  undefined8 uVar24;
  int32_t iVar25;
  int iVar26;
  int iVar27;
  long lVar28;
  long lVar29;
  int iVar30;
  long lVar31;
  bool bVar32;
  type t;
  IdxElement local_178;
  IdxElement local_124;
  cpp_dec_float<100U,_int,_void> local_d0;
  cpp_dec_float<100U,_int,_void> local_80;
  
  lVar28 = 2;
  do {
    iVar3 = SPxShellsort<soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxElement,_soplex::SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::IdxCompare>
            ::incs[lVar28];
    lVar29 = (long)start + (long)iVar3;
    lVar31 = lVar29;
    iVar30 = start;
    if ((int)lVar29 <= end) {
      do {
        iVar4 = keys[lVar31].idx;
        puVar2 = keys[lVar31].val.m_backend.data._M_elems + 0xc;
        uVar10 = *(undefined8 *)puVar2;
        uVar11 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[lVar31].val.m_backend.data._M_elems + 8;
        uVar12 = *(undefined8 *)puVar2;
        uVar13 = *(undefined8 *)(puVar2 + 2);
        puVar2 = keys[lVar31].val.m_backend.data._M_elems + 4;
        uVar14 = *(undefined8 *)puVar2;
        uVar15 = *(undefined8 *)(puVar2 + 2);
        uVar16 = *(undefined8 *)keys[lVar31].val.m_backend.data._M_elems;
        uVar17 = *(undefined8 *)(keys[lVar31].val.m_backend.data._M_elems + 2);
        iVar5 = keys[lVar31].val.m_backend.exp;
        bVar32 = keys[lVar31].val.m_backend.neg;
        fVar6 = keys[lVar31].val.m_backend.fpclass;
        iVar7 = keys[lVar31].val.m_backend.prec_elem;
        iVar27 = (int)lVar31;
        iVar9 = iVar30;
        if (lVar29 <= lVar31) {
          do {
            local_124.idx = keys[iVar9].idx;
            local_124.val.m_backend.data._M_elems._0_8_ =
                 *(undefined8 *)keys[iVar9].val.m_backend.data._M_elems;
            local_124.val.m_backend.data._M_elems._8_8_ =
                 *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 2);
            puVar2 = keys[iVar9].val.m_backend.data._M_elems + 4;
            local_124.val.m_backend.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_124.val.m_backend.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = keys[iVar9].val.m_backend.data._M_elems + 8;
            local_124.val.m_backend.data._M_elems._32_8_ = *(undefined8 *)puVar2;
            local_124.val.m_backend.data._M_elems._40_8_ = *(undefined8 *)(puVar2 + 2);
            puVar2 = keys[iVar9].val.m_backend.data._M_elems + 0xc;
            local_124.val.m_backend.data._M_elems._48_8_ = *(undefined8 *)puVar2;
            local_124.val.m_backend.data._M_elems._56_8_ = *(undefined8 *)(puVar2 + 2);
            local_124.val.m_backend.exp = keys[iVar9].val.m_backend.exp;
            local_124.val.m_backend.neg = keys[iVar9].val.m_backend.neg;
            local_124.val.m_backend.fpclass = keys[iVar9].val.m_backend.fpclass;
            local_124.val.m_backend.prec_elem = keys[iVar9].val.m_backend.prec_elem;
            local_178.idx = iVar4;
            local_178.val.m_backend.data._M_elems._0_8_ = uVar16;
            local_178.val.m_backend.data._M_elems._8_8_ = uVar17;
            local_178.val.m_backend.data._M_elems._16_8_ = uVar14;
            local_178.val.m_backend.data._M_elems._24_8_ = uVar15;
            local_178.val.m_backend.data._M_elems._32_8_ = uVar12;
            local_178.val.m_backend.data._M_elems._40_8_ = uVar13;
            local_178.val.m_backend.data._M_elems._48_8_ = uVar10;
            local_178.val.m_backend.data._M_elems._56_8_ = uVar11;
            local_178.val.m_backend.exp = iVar5;
            local_178.val.m_backend.neg = bVar32;
            local_178.val.m_backend.fpclass = fVar6;
            local_178.val.m_backend.prec_elem = iVar7;
            SPxPricer<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::IdxCompare::operator()
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d0,compare,&local_178,&local_124);
            iVar27 = iVar9;
            if (local_d0.fpclass == cpp_dec_float_NaN) break;
            boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::
            cpp_dec_float<long_long>(&local_80,0,(type *)0x0);
            iVar26 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                               (&local_d0,&local_80);
            if (-1 < iVar26) break;
            iVar27 = iVar3 + iVar9;
            pIVar1 = keys + iVar9;
            keys[iVar27].idx = pIVar1->idx;
            uVar18 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 2);
            uVar19 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 4);
            uVar20 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 6);
            uVar21 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 8);
            uVar22 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 10);
            uVar23 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 0xc);
            uVar24 = *(undefined8 *)(keys[iVar9].val.m_backend.data._M_elems + 0xe);
            *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems =
                 *(undefined8 *)keys[iVar9].val.m_backend.data._M_elems;
            *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar18;
            puVar2 = keys[iVar27].val.m_backend.data._M_elems + 4;
            *(undefined8 *)puVar2 = uVar19;
            *(undefined8 *)(puVar2 + 2) = uVar20;
            puVar2 = keys[iVar27].val.m_backend.data._M_elems + 8;
            *(undefined8 *)puVar2 = uVar21;
            *(undefined8 *)(puVar2 + 2) = uVar22;
            puVar2 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
            *(undefined8 *)puVar2 = uVar23;
            *(undefined8 *)(puVar2 + 2) = uVar24;
            keys[iVar27].val.m_backend.exp = (pIVar1->val).m_backend.exp;
            keys[iVar27].val.m_backend.neg = (pIVar1->val).m_backend.neg;
            iVar25 = (pIVar1->val).m_backend.prec_elem;
            keys[iVar27].val.m_backend.fpclass = (pIVar1->val).m_backend.fpclass;
            keys[iVar27].val.m_backend.prec_elem = iVar25;
            iVar27 = iVar9 - iVar3;
            bVar8 = (int)lVar29 <= iVar9;
            iVar9 = iVar27;
          } while (bVar8);
          iVar27 = iVar27 + iVar3;
        }
        keys[iVar27].idx = iVar4;
        *(undefined8 *)keys[iVar27].val.m_backend.data._M_elems = uVar16;
        *(undefined8 *)(keys[iVar27].val.m_backend.data._M_elems + 2) = uVar17;
        puVar2 = keys[iVar27].val.m_backend.data._M_elems + 4;
        *(undefined8 *)puVar2 = uVar14;
        *(undefined8 *)(puVar2 + 2) = uVar15;
        puVar2 = keys[iVar27].val.m_backend.data._M_elems + 8;
        *(undefined8 *)puVar2 = uVar12;
        *(undefined8 *)(puVar2 + 2) = uVar13;
        puVar2 = keys[iVar27].val.m_backend.data._M_elems + 0xc;
        *(undefined8 *)puVar2 = uVar10;
        *(undefined8 *)(puVar2 + 2) = uVar11;
        keys[iVar27].val.m_backend.exp = iVar5;
        keys[iVar27].val.m_backend.neg = bVar32;
        keys[iVar27].val.m_backend.fpclass = fVar6;
        keys[iVar27].val.m_backend.prec_elem = iVar7;
        lVar31 = lVar31 + 1;
        iVar30 = iVar30 + 1;
      } while (end + 1 != (int)lVar31);
    }
    bVar32 = lVar28 == 0;
    lVar28 = lVar28 + -1;
    if (bVar32) {
      return;
    }
  } while( true );
}

Assistant:

void SPxShellsort(T* keys, int end, COMPARATOR& compare, int start = 0)
{
   static const int incs[3] = {1, 5, 19}; /* sequence of increments */
   int k;

   assert(start <= end);

   for(k = 2; k >= 0; --k)
   {
      int h = incs[k];
      int first = h + start;
      int i;

      for(i = first; i <= end; ++i)
      {
         int j;
         T tempkey = keys[i];

         j = i;

         while(j >= first && compare(tempkey, keys[j - h]) < 0)
         {
            keys[j] = keys[j - h];
            j -= h;
         }

         keys[j] = tempkey;
      }
   }
}